

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O2

bool __thiscall
AlternativeLoader::altCheckSection(AlternativeLoader *this,string *mode,string *line)

{
  char cVar1;
  unsigned_long i;
  ulong uVar2;
  
  cVar1 = *(line->_M_dataplus)._M_p;
  if (cVar1 == '[') {
    std::__cxx11::string::assign((char *)mode);
    for (uVar2 = 1; uVar2 < line->_M_string_length - 1; uVar2 = uVar2 + 1) {
      if ((line->_M_dataplus)._M_p[uVar2] != ']') {
        std::__cxx11::string::push_back((char)mode);
      }
    }
  }
  return cVar1 == '[';
}

Assistant:

void MapLoader::setMapFile(std::string newMapFile) {
    pMapFile = new std::string(std::move(newMapFile));
}